

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

void __thiscall
sf::RenderTarget::draw
          (RenderTarget *this,Vertex *vertices,size_t vertexCount,PrimitiveType type,
          RenderStates *states)

{
  Vector2f *pVVar1;
  bool bVar2;
  ulong uVar3;
  ulong in_RDX;
  void *in_RSI;
  long *in_RDI;
  long in_R8;
  Vector2f VVar4;
  char *data_1;
  char *data;
  bool enableTexCoordsArray;
  Vertex *vertex;
  size_t i;
  bool useVertexCache;
  RenderStates *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  byte bVar5;
  RenderTarget *in_stack_ffffffffffffffa0;
  Uint64 in_stack_ffffffffffffffa8;
  undefined1 useVertexCache_00;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar6;
  ulong local_38;
  
  if (((in_RSI != (void *)0x0) && (in_RDX != 0)) &&
     ((bVar2 = anon_unknown.dwarf_3ae181::RenderTargetImpl::isActive(in_stack_ffffffffffffffa8),
      bVar2 || (uVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,1), (uVar3 & 1) != 0)))) {
    useVertexCache_00 = (undefined1)(in_stack_ffffffffffffffa8 >> 0x38);
    bVar2 = in_RDX < 5;
    if (bVar2) {
      for (local_38 = 0; useVertexCache_00 = (undefined1)(in_stack_ffffffffffffffa8 >> 0x38),
          local_38 < in_RDX; local_38 = local_38 + 1) {
        pVVar1 = (Vector2f *)((long)in_RDI + local_38 * 0x14 + 0x184);
        VVar4 = sf::operator*((Transform *)in_stack_ffffffffffffff88,(Vector2f *)0x2c1fe7);
        *pVVar1 = VVar4;
        pVVar1[1].x = *(float *)((long)in_RSI + local_38 * 0x14 + 8);
        *(undefined8 *)&pVVar1[1].y = *(undefined8 *)((long)in_RSI + local_38 * 0x14 + 0xc);
      }
    }
    setupDraw((RenderTarget *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
              (bool)useVertexCache_00,(RenderStates *)in_stack_ffffffffffffffa0);
    bVar5 = true;
    if (*(long *)(in_R8 + 0x58) == 0) {
      bVar5 = *(long *)(in_R8 + 0x60) != 0;
    }
    bVar6 = bVar5;
    if (((*(byte *)(in_RDI + 0x2b) & 1) == 0) || (bVar5 != (*(byte *)(in_RDI + 0x30) & 1))) {
      if ((bool)bVar5 == false) {
        (*sf_glad_glDisableClientState)(0x8078);
      }
      else {
        (*sf_glad_glEnableClientState)(0x8078);
      }
    }
    if ((((*(byte *)(in_RDI + 0x2b) & 1) == 0) || (!bVar2)) ||
       ((*(byte *)((long)in_RDI + 0x181) & 1) == 0)) {
      if (bVar2) {
        in_RSI = (void *)((long)in_RDI + 0x184);
      }
      (*sf_glad_glVertexPointer)(2,0x1406,0x14,in_RSI);
      (*sf_glad_glColorPointer)(4,0x1401,0x14,(void *)((long)in_RSI + 8));
      if ((bVar6 & 1) != 0) {
        (*sf_glad_glTexCoordPointer)(2,0x1406,0x14,(void *)((long)in_RSI + 0xc));
      }
    }
    else if (((bVar6 & 1) != 0) && ((*(byte *)(in_RDI + 0x30) & 1) == 0)) {
      in_stack_ffffffffffffffa0 = (RenderTarget *)((long)in_RDI + 0x184);
      (*sf_glad_glTexCoordPointer)(2,0x1406,0x14,in_RDI + 0x32);
    }
    drawPrimitives(in_stack_ffffffffffffffa0,(PrimitiveType)((ulong)in_RDI >> 0x20),
                   CONCAT17(bVar5,in_stack_ffffffffffffff90),(size_t)in_stack_ffffffffffffff88);
    cleanupDraw((RenderTarget *)CONCAT17(bVar5,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88)
    ;
    *(bool *)((long)in_RDI + 0x181) = bVar2;
    *(byte *)(in_RDI + 0x30) = bVar6 & 1;
  }
  return;
}

Assistant:

void RenderTarget::draw(const Vertex* vertices, std::size_t vertexCount,
                        PrimitiveType type, const RenderStates& states)
{
    // Nothing to draw?
    if (!vertices || (vertexCount == 0))
        return;

    // GL_QUADS is unavailable on OpenGL ES
    #ifdef SFML_OPENGL_ES
        if (type == Quads)
        {
            err() << "sf::Quads primitive type is not supported on OpenGL ES platforms, drawing skipped" << std::endl;
            return;
        }
    #endif

    if (RenderTargetImpl::isActive(m_id) || setActive(true))
    {
        // Check if the vertex count is low enough so that we can pre-transform them
        bool useVertexCache = (vertexCount <= StatesCache::VertexCacheSize);

        if (useVertexCache)
        {
            // Pre-transform the vertices and store them into the vertex cache
            for (std::size_t i = 0; i < vertexCount; ++i)
            {
                Vertex& vertex = m_cache.vertexCache[i];
                vertex.position = states.transform * vertices[i].position;
                vertex.color = vertices[i].color;
                vertex.texCoords = vertices[i].texCoords;
            }
        }

        setupDraw(useVertexCache, states);

        // Check if texture coordinates array is needed, and update client state accordingly
        bool enableTexCoordsArray = (states.texture || states.shader);
        if (!m_cache.enable || (enableTexCoordsArray != m_cache.texCoordsArrayEnabled))
        {
            if (enableTexCoordsArray)
                glCheck(glEnableClientState(GL_TEXTURE_COORD_ARRAY));
            else
                glCheck(glDisableClientState(GL_TEXTURE_COORD_ARRAY));
        }

        // If we switch between non-cache and cache mode or enable texture
        // coordinates we need to set up the pointers to the vertices' components
        if (!m_cache.enable || !useVertexCache || !m_cache.useVertexCache)
        {
            const char* data = reinterpret_cast<const char*>(vertices);

            // If we pre-transform the vertices, we must use our internal vertex cache
            if (useVertexCache)
                data = reinterpret_cast<const char*>(m_cache.vertexCache);

            glCheck(glVertexPointer(2, GL_FLOAT, sizeof(Vertex), data + 0));
            glCheck(glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(Vertex), data + 8));
            if (enableTexCoordsArray)
                glCheck(glTexCoordPointer(2, GL_FLOAT, sizeof(Vertex), data + 12));
        }
        else if (enableTexCoordsArray && !m_cache.texCoordsArrayEnabled)
        {
            // If we enter this block, we are already using our internal vertex cache
            const char* data = reinterpret_cast<const char*>(m_cache.vertexCache);

            glCheck(glTexCoordPointer(2, GL_FLOAT, sizeof(Vertex), data + 12));
        }

        drawPrimitives(type, 0, vertexCount);
        cleanupDraw(states);

        // Update the cache
        m_cache.useVertexCache = useVertexCache;
        m_cache.texCoordsArrayEnabled = enableTexCoordsArray;
    }
}